

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnswerLiteralManager.cpp
# Opt level: O0

Clause * __thiscall
Shell::AnswerLiteralManager::getResolverClause(AnswerLiteralManager *this,uint pred)

{
  TermList elem;
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  uint uVar4;
  Symbol *this_00;
  undefined4 in_ESI;
  DHMap<unsigned_int,_Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2> *in_RDI;
  SingletonIterator<Kernel::Literal_*> SVar5;
  Literal *lit;
  uint i;
  uint arity;
  Symbol *predSym;
  Clause *res;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  DHMap<unsigned_int,_Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_ffffffffffffff48;
  Stack<Kernel::TermList> *in_stack_ffffffffffffff50;
  Clause *val;
  Clause *pCVar6;
  NonspecificInference0 local_92 [9];
  TermList *in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff8f;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  undefined8 in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa1;
  uint local_40;
  Clause *local_20;
  Clause *local_8;
  
  bVar1 = Lib::DHMap<unsigned_int,_Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::find
                    (in_stack_ffffffffffffff48,
                     (uint *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (Clause **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (bVar1) {
    local_8 = local_20;
  }
  else {
    if (getResolverClause(unsigned_int)::args == '\0') {
      iVar3 = __cxa_guard_acquire(&getResolverClause(unsigned_int)::args);
      if (iVar3 != 0) {
        Lib::Stack<Kernel::TermList>::Stack
                  (in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
        __cxa_atexit(Lib::Stack<Kernel::TermList>::~Stack,&getResolverClause::args,&__dso_handle);
        __cxa_guard_release(&getResolverClause(unsigned_int)::args);
      }
    }
    Lib::Stack<Kernel::TermList>::reset(&getResolverClause::args);
    this_00 = Kernel::Signature::getPredicate
                        ((Signature *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c);
    uVar4 = Kernel::Signature::Symbol::arity(this_00);
    for (local_40 = 0; local_40 < uVar4; local_40 = local_40 + 1) {
      Kernel::TermList::TermList
                ((TermList *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,SUB41((uint)in_stack_ffffffffffffff38 >> 0x18,0));
      elem._content._4_4_ = in_stack_ffffffffffffff44;
      elem._content._0_4_ = in_stack_ffffffffffffff40;
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),elem);
    }
    Lib::Stack<Kernel::TermList>::begin(&getResolverClause::args);
    Kernel::Literal::create
              (in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff8f,
               in_stack_ffffffffffffff80);
    SVar5 = Lib::getSingletonIterator<Kernel::Literal*>((Literal *)0xb7c41b);
    uVar2 = SVar5._finished;
    Kernel::NonspecificInference0::NonspecificInference0(local_92,AXIOM,ANSWER_LITERAL_RESOLVER);
    val = (Clause *)(local_92 + 1);
    Kernel::Inference::Inference
              ((Inference *)CONCAT44(uVar4,in_ESI),
               (NonspecificInference0 *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    SVar5._el._0_1_ = uVar2;
    SVar5._0_8_ = in_stack_ffffffffffffff98;
    SVar5._el._1_7_ = in_stack_ffffffffffffffa1;
    local_8 = Kernel::Clause::fromIterator<Lib::SingletonIterator<Kernel::Literal*>>
                        (SVar5,(Inference *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    pCVar6 = local_8;
    Kernel::Inference::~Inference((Inference *)(local_92 + 1));
    Lib::DHMap<unsigned_int,_Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
              (in_RDI,(uint)((ulong)pCVar6 >> 0x20),val);
  }
  return local_8;
}

Assistant:

Clause* AnswerLiteralManager::getResolverClause(unsigned pred)
{
  Clause* res;
  if(_resolverClauses.find(pred, res)) {
    return res;
  }

  static Stack<TermList> args;
  args.reset();

  Signature::Symbol* predSym = env.signature->getPredicate(pred);
  ASS(predSym->answerPredicate());
  unsigned arity = predSym->arity();

  for(unsigned i=0; i<arity; i++) {
    args.push(TermList(i, false));
  }
  Literal* lit = Literal::create(pred, arity, true, args.begin());
  res = Clause::fromIterator(getSingletonIterator(lit),NonspecificInference0(UnitInputType::AXIOM,InferenceRule::ANSWER_LITERAL_RESOLVER));

  _resolverClauses.insert(pred, res);
  return res;
}